

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListBuilder * __thiscall
capnp::_::PointerBuilder::getStructList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize elementSize,
          word *defaultValue)

{
  ushort uVar1;
  CapTableBuilder *capTable;
  word *pwVar2;
  BuilderArena *pBVar3;
  AllocateResult AVar4;
  word *result_2;
  WirePointer *pWVar5;
  SegmentBuilder *pSVar6;
  StructSize SVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ushort uVar10;
  word *pwVar11;
  ushort uVar12;
  WirePointer *pWVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  word *pwVar17;
  uint uVar18;
  SegmentBuilder *this_00;
  ulong uVar19;
  int iVar20;
  StructSize SVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  WirePointer *pWVar25;
  WirePointer *dst;
  WirePointer *src;
  bool bVar26;
  AllocateResult AVar27;
  ElementSize oldSize;
  AllocateResult local_118;
  uint local_108;
  StructSize local_104;
  ulong local_100;
  Iterator __end5;
  WirePointer *local_e0;
  WirePointer *local_b8;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  pWVar5 = this->pointer;
  local_118.words = (word *)pWVar5;
  local_118.segment = this->segment;
  capTable = this->capTable;
  uVar18 = (uint)elementSize >> 0x10;
  local_104 = elementSize;
  if ((pWVar5->field_1).upper32Bits == 0 && (pWVar5->offsetAndKind).value == 0) goto LAB_00232c9e;
  pWVar5 = pWVar5 + (long)((int)(pWVar5->offsetAndKind).value >> 2) + 1;
  do {
    pwVar2 = local_118.words;
    AVar27 = local_118;
    AVar4 = local_118;
    if (((local_118.words)->content & 3) == 2) {
      pSVar6 = BuilderArena::getSegment
                         ((BuilderArena *)((local_118.segment)->super_SegmentReader).arena,
                          (SegmentId)*(uint *)((long)&(local_118.words)->content + 4));
      uVar16 = (uint)pwVar2->content;
      pwVar11 = (pSVar6->super_SegmentReader).ptr.ptr;
      uVar14 = (ulong)(uVar16 & 0xfffffff8);
      pwVar2 = (word *)((long)&pwVar11->content + uVar14);
      AVar4.words = pwVar2;
      AVar4.segment = pSVar6;
      pwVar11 = (word *)((long)&pwVar11[1].content + uVar14);
      if ((uVar16 & 4) == 0) {
        pWVar5 = (WirePointer *)(pwVar11 + ((int)pwVar2->content >> 2));
        AVar27 = local_118;
      }
      else {
        pSVar6 = BuilderArena::getSegment
                           ((BuilderArena *)(pSVar6->super_SegmentReader).arena,
                            (SegmentId)*(uint *)((long)&pwVar2->content + 4));
        AVar4.words = pwVar11;
        AVar4.segment = pSVar6;
        pWVar5 = (WirePointer *)
                 ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((uint)pwVar2->content & 0xfffffff8));
        AVar27 = local_118;
      }
    }
    SVar7 = local_104;
    this_00 = AVar4.segment;
    local_118.words = AVar27.words;
    pwVar2 = local_118.words;
    local_118.segment = AVar27.segment;
    pSVar6 = local_118.segment;
    local_118 = AVar27;
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (Kind)(AVar4.words)->content & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.left == LIST) {
      uVar16 = *(uint *)((long)&(AVar4.words)->content + 4);
      oldSize = (ElementSize)uVar16 & INLINE_COMPOSITE;
      uVar10 = elementSize.pointers;
      if (oldSize == INLINE_COMPOSITE) {
        local_e0 = pWVar5 + 1;
        _kjCondition.left = (uint)*(uint64_t *)&(pWVar5->offsetAndKind).value & 3;
        _kjCondition.right = STRUCT;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = _kjCondition.left == 0;
        if (_kjCondition.left == 0) {
          uVar1 = *(ushort *)&pWVar5->field_1;
          uVar12 = *(ushort *)((long)&pWVar5->field_1 + 2);
          uVar9 = (ulong)((uint)uVar12 + (uint)uVar1);
          uVar15 = (uint)*(uint64_t *)&(pWVar5->offsetAndKind).value >> 2 & 0x1fffffff;
          uVar14 = (ulong)uVar15;
          SVar7.pointers = 0;
          SVar7.data = uVar1;
          local_100 = uVar9;
          if (uVar12 < uVar10 || uVar1 < local_104.data) {
            SVar21 = SVar7;
            if (uVar1 <= local_104.data) {
              SVar21 = local_104;
            }
            local_108 = uVar18;
            if (uVar10 < uVar12) {
              local_108 = (uint)uVar12;
            }
            SVar7 = (StructSize)((uint)SVar21 & 0xffff);
            local_100 = (ulong)(local_108 + (int)SVar7);
            uVar24 = uVar14 * local_100;
            if (0x1ffffffe < uVar24) {
              WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&_kjCondition);
            }
            pwVar2 = local_118.words;
            if (((local_118.words)->content & 3) == 2) {
              pSVar6 = BuilderArena::getSegment
                                 ((BuilderArena *)((local_118.segment)->super_SegmentReader).arena,
                                  (SegmentId)*(uint *)((long)&(local_118.words)->content + 4));
              if (pSVar6->readOnly == false) {
                uVar16 = (uint)pwVar2->content;
                puVar8 = (undefined8 *)
                         ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                         (ulong)(uVar16 & 0xfffffff8));
                if ((uVar16 & 4) == 0) {
                  *puVar8 = 0;
                }
                else {
                  *puVar8 = 0;
                  puVar8[1] = 0;
                }
              }
            }
            pwVar2->content = 0;
            iVar20 = (int)uVar24;
            AVar27 = local_118;
            if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_118.words + 4))->
                upper32Bits != 0 || ((WireValue<uint32_t> *)&(local_118.words)->content)->value != 0
               ) {
              WireHelpers::zeroObject(local_118.segment,capTable,(WirePointer *)local_118.words);
              AVar27 = local_118;
            }
            local_118.words = AVar27.words;
            local_118.segment = AVar27.segment;
            pwVar2 = (local_118.segment)->pos;
            pwVar11 = (word *)0x0;
            if ((long)(ulong)(iVar20 + 1) <=
                (long)((long)((local_118.segment)->super_SegmentReader).ptr.ptr +
                      (((local_118.segment)->super_SegmentReader).ptr.size_ * 8 - (long)pwVar2)) >>
                3) {
              (local_118.segment)->pos = pwVar2 + (iVar20 + 1);
              pwVar11 = pwVar2;
            }
            if (pwVar11 == (word *)0x0) {
              pBVar3 = (BuilderArena *)((local_118.segment)->super_SegmentReader).arena;
              local_118 = AVar27;
              if (0x1fffffff < iVar20 + 2U) {
                WireHelpers::allocate::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&_kjCondition);
              }
              AVar27 = BuilderArena::allocate(pBVar3,iVar20 + 2U);
              *(uint *)&(local_118.words)->content =
                   (int)AVar27.words - *(int *)&((AVar27.segment)->super_SegmentReader).ptr.ptr &
                   0xfffffff8U | 2;
              *(uint *)((long)&(local_118.words)->content + 4) =
                   ((AVar27.segment)->super_SegmentReader).id.value;
              *(undefined4 *)&(AVar27.words)->content = 1;
              pwVar11 = AVar27.words + 1;
            }
            else {
              *(uint *)&(local_118.words)->content =
                   ((uint)((ulong)((long)pwVar11 - (long)local_118.words) >> 1) & 0xfffffffc) - 3;
            }
            local_118.words = AVar27.words;
            *(int *)((long)&(local_118.words)->content + 4) = iVar20 * 8 + 7;
            *(uint *)&pwVar11->content = uVar15 * 4;
            *(StructDataWordCount *)((long)&pwVar11->content + 4) = SVar21.data;
            *(short *)((long)&pwVar11->content + 6) = (short)local_108;
            if (uVar15 != 0) {
              pWVar25 = (WirePointer *)(pwVar11 + ((ulong)(uint)SVar21 & 0xffff) + 1);
              iVar20 = (int)local_100;
              local_b8 = pWVar5 + (ulong)uVar1 + 1;
              iVar23 = 0;
              pWVar13 = (WirePointer *)(pwVar11 + 1);
              ___end5 = uVar14;
              do {
                local_118 = AVar27;
                if (uVar1 != 0) {
                  memcpy(pWVar13,local_e0,(ulong)uVar1 * 8);
                }
                uVar14 = (ulong)uVar12;
                dst = pWVar25;
                src = local_b8;
                AVar27 = local_118;
                if (uVar12 != 0) {
                  do {
                    WireHelpers::transferPointer(local_118.segment,dst,this_00,src);
                    dst = dst + 1;
                    src = src + 1;
                    uVar14 = uVar14 - 1;
                    AVar27 = local_118;
                  } while (uVar14 != 0);
                }
                pWVar13 = pWVar13 + local_100;
                local_e0 = local_e0 + uVar9;
                iVar23 = iVar23 + 1;
                pWVar25 = (WirePointer *)
                          ((long)&(pWVar25->offsetAndKind).value + (ulong)(uint)(iVar20 * 8));
                local_b8 = (WirePointer *)
                           ((long)&(local_b8->offsetAndKind).value +
                           (ulong)(((uint)uVar12 + (uint)uVar1) * 8));
                uVar14 = ___end5;
              } while (iVar23 != (int)___end5);
            }
            local_118 = AVar27;
            if (0x1ffffffe < uVar9 * uVar14) {
              WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&_kjCondition);
            }
            iVar20 = (int)(uVar9 * uVar14) + 1;
            uVar12 = (ushort)local_108;
            if (iVar20 != 0) {
              memset(pWVar5,0,(ulong)(uint)(iVar20 * 8));
            }
            local_e0 = (WirePointer *)(pwVar11 + 1);
LAB_002336e4:
            uVar15 = (uint)uVar14;
            this_00 = local_118.segment;
            AVar27 = local_118;
          }
LAB_002336e9:
          __return_storage_ptr__->segment = this_00;
          __return_storage_ptr__->capTable = capTable;
          __return_storage_ptr__->ptr = (byte *)local_e0;
          __return_storage_ptr__->elementCount = uVar15;
          __return_storage_ptr__->step = (int)local_100 << 6;
          __return_storage_ptr__->structDataSize = (int)SVar7 << 6;
          __return_storage_ptr__->structPointerCount = uVar12;
          __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
          iVar20 = 1;
          local_118 = AVar27;
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x5c7,FAILED,"oldTag->kind() == WirePointer::STRUCT",
                     "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\""
                     ,&_kjCondition,
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::~Fault(&f);
          iVar20 = 2;
        }
      }
      else {
        bVar26 = oldSize == POINTER;
        uVar15 = uVar16 >> 3;
        uVar14 = (ulong)uVar15;
        if ((uVar16 & 7) == 0) {
          local_100 = (ulong)(uVar18 + ((uint)local_104 & 0xffff));
          uVar14 = local_100 * uVar14;
          if (0x1ffffffe < uVar14) {
            WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pwVar2 + 4))->upper32Bits != 0 ||
              ((WireValue<uint32_t> *)&pwVar2->content)->value != 0) {
            WireHelpers::zeroObject(pSVar6,capTable,(WirePointer *)pwVar2);
          }
          pwVar11 = pSVar6->pos;
          uVar9 = uVar14 + 1 & 0xffffffff;
          pwVar17 = (word *)0x0;
          if ((long)uVar9 <=
              (long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                    ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)pwVar11)) >> 3) {
            pSVar6->pos = pwVar11 + uVar9;
            pwVar17 = pwVar11;
          }
          if (pwVar17 == (word *)0x0) {
            uVar16 = (int)uVar14 + 2;
            pBVar3 = (BuilderArena *)(pSVar6->super_SegmentReader).arena;
            if (0x1fffffff < uVar16) {
              WireHelpers::allocate::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&_kjCondition);
            }
            AVar27 = BuilderArena::allocate(pBVar3,uVar16);
            ((WireValue<uint32_t> *)&pwVar2->content)->value =
                 (int)AVar27.words - *(int *)&((AVar27.segment)->super_SegmentReader).ptr.ptr &
                 0xfffffff8U | 2;
            *(uint *)((long)pwVar2 + 4) = ((AVar27.segment)->super_SegmentReader).id.value;
            *(undefined4 *)&(AVar27.words)->content = 1;
            pwVar17 = AVar27.words + 1;
          }
          else {
            ((WireValue<uint32_t> *)&pwVar2->content)->value =
                 ((uint)((ulong)((long)pwVar17 - (long)pwVar2) >> 1) & 0xfffffffc) - 3;
          }
          this_00 = AVar27.segment;
          *(int *)((long)&(AVar27.words)->content + 4) = (int)uVar14 * 8 + 7;
          *(uint *)&pwVar17->content = uVar15 * 4;
          *(StructDataWordCount *)((long)&pwVar17->content + 4) = local_104.data;
          *(ushort *)((long)&pwVar17->content + 6) = uVar10;
          local_e0 = (WirePointer *)(pwVar17 + 1);
          SVar7 = (StructSize)((uint)SVar7 & 0xffff);
          uVar12 = uVar10;
          AVar27 = local_118;
          goto LAB_002336e9;
        }
        uVar9 = (ulong)oldSize;
        uVar15 = (&BITS_PER_ELEMENT_TABLE)[uVar9];
        _kjCondition._0_8_ = &oldSize;
        _kjCondition.op.content.ptr = "uilder.slice(1, 3)";
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_71c59;
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        ___end5 = uVar14;
        if (oldSize != BIT) {
          if (oldSize == POINTER) {
            SVar21 = local_104;
            local_108 = uVar18 + (uVar18 == 0);
          }
          else {
            SVar21 = (StructSize)
                     (((uint)local_104 & 0xffff) + (uint)(((uint)local_104 & 0xffff) == 0));
            local_108 = uVar18;
          }
          SVar7 = (StructSize)((uint)SVar21 & 0xffff);
          local_100 = (ulong)((local_108 & 0xffff) + (int)SVar7);
          uVar24 = local_100 * uVar14;
          if (0x1ffffffe < uVar24) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          pwVar2 = local_118.words;
          if (((local_118.words)->content & 3) == 2) {
            pSVar6 = BuilderArena::getSegment
                               ((BuilderArena *)((local_118.segment)->super_SegmentReader).arena,
                                (SegmentId)*(uint *)((long)&(local_118.words)->content + 4));
            if (pSVar6->readOnly == false) {
              uVar22 = (uint)pwVar2->content;
              puVar8 = (undefined8 *)
                       ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                       (ulong)(uVar22 & 0xfffffff8));
              if ((uVar22 & 4) == 0) {
                *puVar8 = 0;
              }
              else {
                *puVar8 = 0;
                puVar8[1] = 0;
              }
            }
          }
          pwVar2->content = 0;
          AVar27 = local_118;
          if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_118.words + 4))->
              upper32Bits != 0 || ((WireValue<uint32_t> *)&(local_118.words)->content)->value != 0)
          {
            WireHelpers::zeroObject(local_118.segment,capTable,(WirePointer *)local_118.words);
            AVar27 = local_118;
          }
          local_118.words = AVar27.words;
          local_118.segment = AVar27.segment;
          pwVar2 = (local_118.segment)->pos;
          uVar19 = uVar24 + 1 & 0xffffffff;
          pwVar11 = (word *)0x0;
          if ((long)uVar19 <=
              (long)((long)((local_118.segment)->super_SegmentReader).ptr.ptr +
                    (((local_118.segment)->super_SegmentReader).ptr.size_ * 8 - (long)pwVar2)) >> 3)
          {
            (local_118.segment)->pos = pwVar2 + uVar19;
            pwVar11 = pwVar2;
          }
          if (pwVar11 == (word *)0x0) {
            uVar22 = (int)uVar24 + 2;
            pBVar3 = (BuilderArena *)((local_118.segment)->super_SegmentReader).arena;
            local_118 = AVar27;
            if (0x1fffffff < uVar22) {
              WireHelpers::allocate::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&_kjCondition);
            }
            AVar27 = BuilderArena::allocate(pBVar3,uVar22);
            *(uint *)&(local_118.words)->content =
                 (int)AVar27.words - *(int *)&((AVar27.segment)->super_SegmentReader).ptr.ptr &
                 0xfffffff8U | 2;
            *(uint *)((long)&(local_118.words)->content + 4) =
                 ((AVar27.segment)->super_SegmentReader).id.value;
            *(undefined4 *)&(AVar27.words)->content = 1;
            pwVar11 = AVar27.words + 1;
          }
          else {
            *(uint *)&(local_118.words)->content =
                 ((uint)((ulong)((long)pwVar11 - (long)local_118.words) >> 1) & 0xfffffffc) - 3;
          }
          local_118.words = AVar27.words;
          *(int *)((long)&(local_118.words)->content + 4) = (int)uVar24 * 8 + 7;
          *(int *)&pwVar11->content = (int)___end5 * 4;
          *(StructDataWordCount *)((long)&pwVar11->content + 4) = SVar21.data;
          *(short *)((long)&pwVar11->content + 6) = (short)local_108;
          local_e0 = (WirePointer *)(pwVar11 + 1);
          iVar20 = (int)local_100;
          local_118 = AVar27;
          if (oldSize == POINTER) {
            if (7 < uVar16) {
              pWVar13 = local_e0 + ((uint)SVar21 & 0xffff);
              uVar9 = ___end5 & 0xffffffff;
              pWVar25 = pWVar5;
              do {
                WireHelpers::transferPointer(local_118.segment,pWVar13,this_00,pWVar25);
                pWVar25 = pWVar25 + 1;
                pWVar13 = (WirePointer *)
                          ((long)&(pWVar13->offsetAndKind).value + (ulong)(uint)(iVar20 * 8));
                uVar16 = (int)uVar9 - 1;
                uVar9 = (ulong)uVar16;
              } while (uVar16 != 0);
            }
          }
          else if (7 < uVar16) {
            uVar24 = (ulong)(uVar15 >> 3);
            uVar19 = ___end5 & 0xffffffff;
            pWVar13 = pWVar5;
            pWVar25 = local_e0;
            do {
              if (0xfffffffffffffffb < uVar9 - 6) {
                memcpy(pWVar25,pWVar13,uVar24);
              }
              pWVar13 = (WirePointer *)((long)&(pWVar13->offsetAndKind).value + uVar24);
              pWVar25 = (WirePointer *)
                        ((long)&(pWVar25->offsetAndKind).value + (ulong)(uint)(iVar20 * 8));
              uVar16 = (int)uVar19 - 1;
              uVar19 = (ulong)uVar16;
            } while (uVar16 != 0);
          }
          uVar14 = ((uint)bVar26 * 0x40 + uVar15) * uVar14;
          uVar9 = uVar14 + 0x3f;
          if (0x7ffffff80 < uVar14) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          uVar14 = ___end5;
          if ((int)(uVar9 >> 6) != 0) {
            memset(pWVar5,0,(ulong)((uint)(uVar9 >> 3) & 0xfffffff8));
          }
          uVar12 = (ushort)local_108;
          goto LAB_002336e4;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[123]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x61b,FAILED,"oldSize != ElementSize::BIT",
                   "_kjCondition,\"Schema mismatch: Found bit list where struct list was expected; upgrading boolean \" \"lists to structs is no longer supported.\""
                   ,(DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)&_kjCondition,
                   (char (*) [123])
                   "Schema mismatch: Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                  );
        kj::_::Debug::Fault::~Fault(&f);
        iVar20 = 2;
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x5bb,FAILED,"oldRef->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getList{Field,Element}() but existing pointer is not a \" \"list.\""
                 ,&_kjCondition,
                 (char (*) [85])
                 "Schema mismatch: Called getList{Field,Element}() but existing pointer is not a list."
                );
      kj::_::Debug::Fault::~Fault(&f);
      iVar20 = 2;
    }
    if (iVar20 != 2) {
      return __return_storage_ptr__;
    }
LAB_00232c9e:
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      __return_storage_ptr__->ptr = (byte *)0x0;
      __return_storage_ptr__->elementCount = 0;
      __return_storage_ptr__->step = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
      __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
      return __return_storage_ptr__;
    }
    pWVar5 = (WirePointer *)
             WireHelpers::copyMessage
                       (&local_118.segment,capTable,(WirePointer **)&local_118.words,
                        (WirePointer *)defaultValue);
    defaultValue = (word *)0x0;
  } while( true );
}

Assistant:

ListBuilder PointerBuilder::getStructList(StructSize elementSize, const word* defaultValue) {
  return WireHelpers::getWritableStructListPointer(
      pointer, segment, capTable, elementSize, defaultValue);
}